

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_int>::__decodeArray
          (FastPForImpl<8U,_unsigned_int> *this,uint32_t *in,size_t *length,uint *out,size_t nvalue)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  pointer pvVar5;
  uint *out_00;
  int *piVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint32_t *puVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint32_t *in_00;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  const_iterator unpackpointers [33];
  undefined8 auStack_930 [248];
  uint32_t *local_170;
  undefined8 local_138 [33];
  
  lVar12 = 0x30;
  uVar11 = 1;
  puVar9 = in + (ulong)*in + 1;
  local_170 = (uint32_t *)
              ((long)in + ((ulong)puVar9[-1] + 3 & 0xfffffffffffffffc) + 8 + (ulong)*in * 4);
  uVar10 = local_170[-1];
  do {
    if ((uVar10 & (uint)(1L << (uVar11 & 0x3f))) != 0) {
      uVar4 = *local_170;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data + lVar12),(ulong)(uVar4 + 0x1f & 0xffffffe0));
      pvVar5 = (this->datatobepacked).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      out_00 = *(uint **)((long)&(pvVar5->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + lVar12);
      local_170 = packingvector<32U>::unpackmetight<unsigned_int>
                            (local_170,out_00,
                             *(long *)((long)&(pvVar5->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data + lVar12 + 8) -
                             (long)out_00 >> 2,(int)uVar11 + 1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data + lVar12),(ulong)uVar4);
    }
    lVar12 = lVar12 + 0x18;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x20);
  auVar13 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar14 = vpbroadcastq_avx512f(ZEXT816(8));
  *length = (long)local_170 - (long)in >> 2;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  auVar15 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
  local_138[0x20] = 0;
  pvVar5 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = 1;
  do {
    vpmullq_avx512dq(auVar15,auVar13);
    auVar15 = vpaddq_avx512f(auVar15,auVar14);
    auVar16 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar5->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data + (long)puVar9));
    auVar16 = vmovdqu64_avx512f(auVar16);
    *(undefined1 (*) [64])(local_138 + lVar12) = auVar16;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x21);
  if (0xff < nvalue) {
    in_00 = in + 1;
    uVar11 = 0;
    do {
      bVar2 = (byte)*puVar9;
      uVar8 = (ulong)bVar2;
      bVar3 = *(byte *)((long)puVar9 + 1);
      uVar10 = (uint)bVar3;
      lVar12 = 0;
      do {
        fastunpack(in_00,(uint32_t *)((long)out + lVar12),(uint)bVar2);
        lVar12 = lVar12 + 0x80;
        in_00 = (uint32_t *)((long)in_00 + (ulong)((uint)bVar2 * 4));
      } while (lVar12 != 0x400);
      if (bVar3 == 0) {
        puVar9 = (uint32_t *)((long)puVar9 + 2);
      }
      else {
        pbVar1 = (byte *)((long)puVar9 + 2);
        puVar9 = (uint32_t *)((long)puVar9 + 3);
        lVar12 = *pbVar1 - uVar8;
        if ((int)lVar12 == 1) {
          do {
            uVar7 = *puVar9;
            puVar9 = (uint32_t *)((long)puVar9 + 1);
            out[(byte)uVar7] = out[(byte)uVar7] | (uint)(1L << (uVar8 & 0x3f));
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        else {
          piVar6 = (int *)local_138[lVar12];
          do {
            uVar7 = *puVar9;
            local_138[lVar12] = piVar6 + 1;
            puVar9 = (uint32_t *)((long)puVar9 + 1);
            out[(byte)uVar7] = out[(byte)uVar7] | *piVar6 << (uVar8 & 0x3f);
            uVar10 = uVar10 - 1;
            piVar6 = piVar6 + 1;
          } while (uVar10 != 0);
        }
      }
      out = out + 0x100;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (uVar11 < nvalue >> 8);
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, IntType *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    IntType bitmap = *(reinterpret_cast<const IntType *>(inexcept));
    inexcept += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if ((bitmap & (1ULL << (k - 1))) != 0) {
        uint32_t tnvalue = *inexcept;
        datatobepacked[k].resize((tnvalue + PACKSIZE - 1) / PACKSIZE * PACKSIZE);
        inexcept = packingvector<32>::unpackmetight(
            inexcept, datatobepacked[k].data(), datatobepacked[k].size(), k);
        datatobepacked[k].resize(tnvalue);
      }
    }
    length = inexcept - initin;
    typename std::vector<IntType>::const_iterator
        unpackpointers[sizeof(IntType) * 8 + 1];
    for (uint32_t k = 1; k <= sizeof(IntType) * 8; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblock<BlockSize>(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint64_t>(1) << b;
          }
        } else {
          typename std::vector<IntType>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (static_cast<uint64_t>(*(exceptionsptr++))) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }